

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint8_t access_get_byte(CPUS390XState_conflict *env,S390Access *access,int offset,uintptr_t ra)

{
  uintptr_t ra_local;
  int offset_local;
  S390Access *access_local;
  CPUS390XState_conflict *env_local;
  
  if (offset < (int)(uint)access->size1) {
    env_local._7_1_ =
         do_access_get_byte(env,access->vaddr1,&access->haddr1,offset,access->mmu_idx,ra);
  }
  else {
    env_local._7_1_ =
         do_access_get_byte(env,access->vaddr2,&access->haddr2,offset - (uint)access->size1,
                            access->mmu_idx,ra);
  }
  return env_local._7_1_;
}

Assistant:

static uint8_t access_get_byte(CPUS390XState *env, S390Access *access,
                               int offset, uintptr_t ra)
{
    if (offset < access->size1) {
        return do_access_get_byte(env, access->vaddr1, &access->haddr1,
                                  offset, access->mmu_idx, ra);
    }
    return do_access_get_byte(env, access->vaddr2, &access->haddr2,
                              offset - access->size1, access->mmu_idx, ra);
}